

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall TPZFront<float>::TPZFront(TPZFront<float> *this,void **vtt,TPZFront<float> *cp)

{
  void *pvVar1;
  long in_RDX;
  undefined8 *in_RSI;
  TPZManVector<long,_10> *in_RDI;
  TPZFront<float> *unaff_retaddr;
  int in_stack_0000000c;
  STensorProductMTData *in_stack_00000010;
  int nthreads;
  TPZStack<int,_10> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  TPZVec<long> *in_stack_ffffffffffffffa8;
  TPZVec<long> *in_stack_ffffffffffffffb0;
  TPZVec<float> *this_00;
  
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,(void **)(in_RSI + 1));
  (in_RDI->super_TPZVec<long>)._vptr_TPZVec = (_func_int **)*in_RSI;
  *(undefined4 *)((long)&(in_RDI->super_TPZVec<long>).fStore + 4) = *(undefined4 *)(in_RDX + 0xc);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)&(in_RDI->super_TPZVec<long>).fNElements,in_RDI);
  TPZVec<long>::TPZVec(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI[1].fExtAlloc[2] = *(long *)(in_RDX + 0xa0);
  this_00 = (TPZVec<float> *)(in_RDI[1].fExtAlloc + 4);
  TPZStack<int,_10>::TPZStack
            ((TPZStack<int,_10> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  TPZVec<float>::TPZVec(this_00,(TPZVec<float> *)&in_RDI[2].super_TPZVec<long>.fNAlloc);
  *(undefined4 *)((long)in_RDI[2].fExtAlloc + 0x1c) = *(undefined4 *)(in_RDX + 0x11c);
  in_RDI[1].fExtAlloc[3] = *(long *)(in_RDX + 0xa8);
  *(undefined4 *)(in_RDI[2].fExtAlloc + 3) = *(undefined4 *)(in_RDX + 0x118);
  if (*(long *)(in_RDX + 0x120) == 0) {
    in_RDI[2].fExtAlloc[4] = 0;
  }
  else {
    STensorProductMTData::NThreads((STensorProductMTData *)0x1cc4cdb);
    pvVar1 = operator_new(0x110);
    STensorProductMTData::STensorProductMTData(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    in_RDI[2].fExtAlloc[4] = (long)pvVar1;
  }
  return;
}

Assistant:

TPZFront<TVar>::TPZFront(const TPZFront<TVar> &cp) : fMaxFront(cp.fMaxFront),
fGlobal(cp.fGlobal), fLocal(cp.fLocal),fFront(cp.fFront),fFree(cp.fFree),
fData(cp.fData),
fDecomposeType(cp.fDecomposeType)
{
	fNextRigidBodyMode = cp.fNextRigidBodyMode;
	fExpandRatio = cp.fExpandRatio;
	if (cp.fProductMTData) {
		const int nthreads = cp.fProductMTData->NThreads();
		this->fProductMTData = new STensorProductMTData(nthreads,this);
	}
	else {
		this->fProductMTData = NULL;
	}
}